

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O3

void __thiscall
BvhNode::BvhNode(BvhNode *this,vector<Hitable_*,_std::allocator<Hitable_*>_> *hitable_vec,double t0,
                double t1)

{
  pointer ppHVar1;
  pointer ppHVar2;
  Hitable **list;
  long lVar3;
  long lVar4;
  
  (this->super_Hitable)._vptr_Hitable = (_func_int **)&PTR_Hit_00127c58;
  ppHVar1 = (hitable_vec->super__Vector_base<Hitable_*,_std::allocator<Hitable_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppHVar2 = (hitable_vec->super__Vector_base<Hitable_*,_std::allocator<Hitable_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar4 = (long)ppHVar2 - (long)ppHVar1 >> 3;
  list = (Hitable **)operator_new__(-(ulong)(lVar4 + 1U >> 0x3d != 0) | lVar4 * 8 + 8U);
  if (ppHVar2 != ppHVar1) {
    lVar3 = 0;
    do {
      list[lVar3] = ppHVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar3);
  }
  Build(this,list,(int)lVar4,t0,t1);
  return;
}

Assistant:

BvhNode::BvhNode(const std::vector<Hitable*> hitable_vec, double t0, double t1) {
  auto n = hitable_vec.size();
  Hitable** list = new Hitable*[n + 1];
  for (size_t i = 0; i < n; i++) {
    list[i] = hitable_vec[i];
  }
  Build(list, n, t0, t1);
}